

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O2

index_t get_next_vertex(index_t *v,index_t idx,index_t k,binomial_coeff_table *binomial_coeff)

{
  pointer pvVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = *v;
  uVar2 = (ulong)(int)uVar5;
  pvVar1 = (binomial_coeff->B).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = uVar5;
  if (idx < *(int *)(*(long *)&pvVar1[uVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl +
                    (long)k * 4)) {
    while (uVar3 = uVar4, uVar5 = (uint)uVar2, 0 < (int)uVar3) {
      uVar4 = uVar3 >> 1;
      if (idx < *(int *)(*(long *)&pvVar1[(int)(uVar5 - uVar4)].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl +
                        (long)k * 4)) {
        uVar5 = (uVar5 - uVar4) - 1;
        *v = uVar5;
        uVar2 = (ulong)uVar5;
        uVar4 = ~uVar4 + uVar3;
      }
    }
  }
  return uVar5;
}

Assistant:

index_t get_next_vertex(index_t& v, const index_t idx, const index_t k, const binomial_coeff_table& binomial_coeff) {
	if (binomial_coeff(v, k) > idx) {
		index_t count = v;
		while (count > 0) {
			index_t i = v;
			index_t step = count >> 1;
			i -= step;
			if (binomial_coeff(i, k) > idx) {
				v = --i;
				count -= step + 1;
			} else
				count = step;
		}
	}
	assert(binomial_coeff(v, k) <= idx);
	assert(binomial_coeff(v + 1, k) > idx);
	return v;
}